

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O3

void BuilderTests<flatbuffers::FlatBufferBuilderImpl<false>,_flatbuffers::FlatBufferBuilderImpl<false>_>
     ::nonempty_builder_movector_test(void)

{
  ulong expval;
  FlatBufferBuilderImpl<false> src;
  FlatBufferBuilderImpl<false> dst;
  FlatBufferBuilder local_110;
  FlatBufferBuilderImpl<false> local_90;
  
  local_110.buf_.allocator_ = (Allocator *)0x0;
  local_110.buf_.own_allocator_ = false;
  local_110.buf_.initial_size_ = 0x400;
  local_110.buf_.max_size_ = 0x7fffffff;
  local_110.buf_.buffer_minalign_ = 8;
  local_110.buf_.reserved_ = 0;
  local_110.buf_.size_ = 0;
  local_110.length_of_64_bit_region_ = 0;
  local_110.nested = false;
  local_110.finished = false;
  local_110.buf_.buf_ = (uint8_t *)0x0;
  local_110.buf_.cur_._0_6_ = 0;
  local_110.buf_.cur_._6_2_ = 0;
  local_110.buf_.scratch_._0_6_ = 0;
  local_110._78_8_ = 0;
  local_110.minalign_ = 1;
  local_110.force_defaults_ = false;
  local_110.dedup_vtables_ = true;
  local_110.string_pool = (StringOffsetMap *)0x0;
  populate1(&local_110);
  expval = (ulong)local_110.buf_.size_;
  flatbuffers::FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl(&local_90,&local_110);
  TestEq<unsigned_long,unsigned_int>
            (expval,local_90.buf_.size_,"\'src_size\' != \'dst.GetSize()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
             ,0x60,
             "static void BuilderTests<flatbuffers::FlatBufferBuilderImpl<>>::nonempty_builder_movector_test() [DestBuilder = flatbuffers::FlatBufferBuilderImpl<>, SrcBuilder = flatbuffers::FlatBufferBuilderImpl<>]"
            );
  TestEq<unsigned_int,int>
            (local_110.buf_.size_,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test_builder.h"
             ,0x61,
             "static void BuilderTests<flatbuffers::FlatBufferBuilderImpl<>>::nonempty_builder_movector_test() [DestBuilder = flatbuffers::FlatBufferBuilderImpl<>, SrcBuilder = flatbuffers::FlatBufferBuilderImpl<>]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_90);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_110);
  return;
}

Assistant:

static void nonempty_builder_movector_test() {
    SrcBuilder src;
    populate1(src);
    size_t src_size = src.GetSize();
    DestBuilder dst(std::move(src));
    TEST_EQ_FUNC(src_size, dst.GetSize());
    TEST_EQ_FUNC(src.GetSize(), 0);
  }